

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cc
# Opt level: O1

Status * __thiscall
draco::Decoder::DecodeBufferToGeometryStep2(Status *__return_storage_ptr__,Decoder *this)

{
  MeshDecoder *pMVar1;
  Status _local_status;
  Status local_38;
  
  MeshDecoder::DecodeStep2
            (&local_38,
             (this->decoder_)._M_t.
             super___uniq_ptr_impl<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>.
             _M_t.
             super__Tuple_impl<0UL,_draco::MeshDecoder_*,_std::default_delete<draco::MeshDecoder>_>.
             super__Head_base<0UL,_draco::MeshDecoder_*,_false>._M_head_impl);
  pMVar1 = (this->decoder_)._M_t.
           super___uniq_ptr_impl<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>._M_t.
           super__Tuple_impl<0UL,_draco::MeshDecoder_*,_std::default_delete<draco::MeshDecoder>_>.
           super__Head_base<0UL,_draco::MeshDecoder_*,_false>._M_head_impl;
  (this->decoder_)._M_t.
  super___uniq_ptr_impl<draco::MeshDecoder,_std::default_delete<draco::MeshDecoder>_>._M_t.
  super__Tuple_impl<0UL,_draco::MeshDecoder_*,_std::default_delete<draco::MeshDecoder>_>.
  super__Head_base<0UL,_draco::MeshDecoder_*,_false>._M_head_impl = (MeshDecoder *)0x0;
  if (pMVar1 != (MeshDecoder *)0x0) {
    (**(code **)((long)(pMVar1->super_PointCloudDecoder)._vptr_PointCloudDecoder + 8))();
  }
  if (local_38.code_ == OK) {
    __return_storage_ptr__->code_ = OK;
    (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->error_msg_).field_2;
    (__return_storage_ptr__->error_msg_)._M_string_length = 0;
    (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
  }
  else {
    __return_storage_ptr__->code_ = local_38.code_;
    (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->error_msg_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->error_msg_,local_38.error_msg_._M_dataplus._M_p,
               local_38.error_msg_._M_dataplus._M_p + local_38.error_msg_._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.error_msg_._M_dataplus._M_p != &local_38.error_msg_.field_2) {
    operator_delete(local_38.error_msg_._M_dataplus._M_p,
                    local_38.error_msg_.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Status Decoder::DecodeBufferToGeometryStep2() {
#ifdef DRACO_MESH_COMPRESSION_SUPPORTED
  const draco::Status _local_status = decoder_->DecodeStep2();
  decoder_.reset();
  if (!_local_status.ok()) {
    return _local_status;
  }
  return OkStatus();
#else
  return Status(Status::DRACO_ERROR, "Unsupported geometry type.");
#endif
}